

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

SourceContextInfo * __thiscall
Js::ScriptContext::CreateSourceContextInfo
          (ScriptContext *this,uint hash,DWORD_PTR hostSourceContext)

{
  JavascriptLibrary *pJVar1;
  BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  Type *address;
  uint uVar3;
  SourceContextInfo *pSVar4;
  Recycler *alloc;
  SourceDynamicProfileManager *pSVar5;
  undefined **local_68;
  SourceContextInfo *sourceContextInfo;
  size_t local_58;
  char *local_50;
  DWORD local_48;
  Type *local_40;
  uint local_34 [2];
  uint hash_local;
  
  local_34[0] = hash;
  EnsureDynamicSourceContextInfoMap(this);
  pSVar4 = GetSourceContextInfo(this,hash);
  pJVar1 = (this->super_ScriptContextBase).javascriptLibrary;
  if (pSVar4 == (SourceContextInfo *)0x0) {
    pBVar2 = (pJVar1->cache).dynamicSourceContextInfoMap.ptr;
    if (pBVar2->count - pBVar2->freeCount < 0x33) {
      local_68 = &SourceContextInfo::typeinfo;
      sourceContextInfo = (SourceContextInfo *)0x0;
      local_58 = 0xffffffffffffffff;
      local_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
      ;
      local_48 = 0xbc9;
      alloc = Memory::Recycler::TrackAllocInfo
                        (this->recycler,(TrackAllocData *)&stack0xffffffffffffff98);
      pSVar4 = (SourceContextInfo *)new<Memory::Recycler>(0x38,alloc,0x56b216);
      local_40 = &pSVar4->sourceDynamicProfileManager;
      (pSVar4->sourceDynamicProfileManager).ptr = (SourceDynamicProfileManager *)0x0;
      local_68 = (undefined **)pSVar4;
      uVar3 = GetNextSourceContextId(this);
      pSVar4->sourceContextId = uVar3;
      pSVar4->dwHostSourceContext = hostSourceContext;
      pSVar4->isHostDynamicDocument = true;
      (pSVar4->field_5).hash = hash;
      pSVar5 = ThreadContext::GetSourceDynamicProfileManager
                         (this->threadContext,this->url,hash,
                          &this->referencesSharedDynamicSourceContextInfo);
      address = local_40;
      Memory::Recycler::WBSetBit((char *)local_40);
      (pSVar4->sourceDynamicProfileManager).ptr = pSVar5;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(address);
      if (hostSourceContext == 0xffffffffffffffff) {
        JsUtil::
        BaseDictionary<unsigned_int,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<unsigned_int,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)(((this->super_ScriptContextBase).javascriptLibrary)->cache).
                      dynamicSourceContextInfoMap.ptr,local_34,
                   (SourceContextInfo **)&stack0xffffffffffffff98);
        pSVar4 = (SourceContextInfo *)local_68;
      }
    }
    else {
      Output::Trace(DynamicProfilePhase,L"Max of dynamic script profile info reached.\n");
      pSVar4 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).
               noContextSourceContextInfo.ptr;
    }
  }
  else {
    pSVar4 = (pJVar1->cache).noContextSourceContextInfo.ptr;
  }
  return pSVar4;
}

Assistant:

SourceContextInfo* ScriptContext::CreateSourceContextInfo(uint hash, DWORD_PTR hostSourceContext)
    {
        EnsureDynamicSourceContextInfoMap();
        if (this->GetSourceContextInfo(hash) != nullptr)
        {
            return this->Cache()->noContextSourceContextInfo;
        }

        if (this->Cache()->dynamicSourceContextInfoMap->Count() > INMEMORY_CACHE_MAX_PROFILE_MANAGER)
        {
            OUTPUT_TRACE(Js::DynamicProfilePhase, _u("Max of dynamic script profile info reached.\n"));
            return this->Cache()->noContextSourceContextInfo;
        }

        // This is capped so we can continue allocating in the arena
        SourceContextInfo * sourceContextInfo = RecyclerNewStructZ(this->GetRecycler(), SourceContextInfo);
        sourceContextInfo->sourceContextId = this->GetNextSourceContextId();
        sourceContextInfo->dwHostSourceContext = hostSourceContext;
        sourceContextInfo->isHostDynamicDocument = true;
        sourceContextInfo->hash = hash;
#if ENABLE_PROFILE_INFO
        sourceContextInfo->sourceDynamicProfileManager = this->threadContext->GetSourceDynamicProfileManager(this->GetUrl(), hash, &referencesSharedDynamicSourceContextInfo);
#endif

        // For the host provided dynamic code (if hostSourceContext is not NoHostSourceContext), do not add to dynamicSourceContextInfoMap
        if (hostSourceContext == Js::Constants::NoHostSourceContext)
        {
            this->Cache()->dynamicSourceContextInfoMap->Add(hash, sourceContextInfo);
        }
        return sourceContextInfo;
    }